

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O0

int PutCoeffs(VP8BitWriter *bw,int ctx,VP8Residual *res)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *in_RDX;
  uint8_t *tab;
  int mask;
  int v;
  int sign;
  int c;
  uint8_t *p;
  int n;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar4;
  int local_40;
  int local_24;
  int local_4;
  
  local_24 = *in_RDX;
  iVar1 = VP8PutBit((VP8BitWriter *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    do {
      do {
        if (0xf < local_24) {
          return 1;
        }
        iVar3 = local_24 + 1;
        iVar1 = (int)*(short *)(*(long *)(in_RDX + 2) + (long)local_24 * 2);
        if (iVar1 < 0) {
          iVar1 = -iVar1;
        }
        iVar4 = iVar1;
        iVar2 = VP8PutBit((VP8BitWriter *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        local_24 = iVar3;
      } while (iVar2 == 0);
      iVar2 = VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
      if (iVar2 != 0) {
        iVar2 = VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        if (iVar2 == 0) {
          iVar1 = VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
          if (iVar1 != 0) {
            VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
          }
        }
        else {
          iVar2 = VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
          if (iVar2 == 0) {
            iVar1 = VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
            if (iVar1 == 0) {
              VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
            }
            else {
              VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
              VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
            }
          }
          else {
            if (iVar1 < 0x13) {
              VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
              VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
              local_40 = 4;
            }
            else if (iVar1 < 0x23) {
              VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
              VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
              local_40 = 8;
            }
            else if (iVar1 < 0x43) {
              VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
              VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
              local_40 = 0x10;
            }
            else {
              VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
              VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
              local_40 = 0x400;
            }
            for (; local_40 != 0; local_40 = local_40 >> 1) {
              VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
            }
          }
        }
      }
      VP8PutBitUniform((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac);
    } while ((iVar3 != 0x10) &&
            (iVar1 = VP8PutBit((VP8BitWriter *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                               in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8), iVar1 != 0));
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int PutCoeffs(VP8BitWriter* const bw, int ctx, const VP8Residual* res) {
  int n = res->first;
  // should be prob[VP8EncBands[n]], but it's equivalent for n=0 or 1
  const uint8_t* p = res->prob[n][ctx];
  if (!VP8PutBit(bw, res->last >= 0, p[0])) {
    return 0;
  }

  while (n < 16) {
    const int c = res->coeffs[n++];
    const int sign = c < 0;
    int v = sign ? -c : c;
    if (!VP8PutBit(bw, v != 0, p[1])) {
      p = res->prob[VP8EncBands[n]][0];
      continue;
    }
    if (!VP8PutBit(bw, v > 1, p[2])) {
      p = res->prob[VP8EncBands[n]][1];
    } else {
      if (!VP8PutBit(bw, v > 4, p[3])) {
        if (VP8PutBit(bw, v != 2, p[4])) {
          VP8PutBit(bw, v == 4, p[5]);
        }
      } else if (!VP8PutBit(bw, v > 10, p[6])) {
        if (!VP8PutBit(bw, v > 6, p[7])) {
          VP8PutBit(bw, v == 6, 159);
        } else {
          VP8PutBit(bw, v >= 9, 165);
          VP8PutBit(bw, !(v & 1), 145);
        }
      } else {
        int mask;
        const uint8_t* tab;
        if (v < 3 + (8 << 1)) {          // VP8Cat3  (3b)
          VP8PutBit(bw, 0, p[8]);
          VP8PutBit(bw, 0, p[9]);
          v -= 3 + (8 << 0);
          mask = 1 << 2;
          tab = VP8Cat3;
        } else if (v < 3 + (8 << 2)) {   // VP8Cat4  (4b)
          VP8PutBit(bw, 0, p[8]);
          VP8PutBit(bw, 1, p[9]);
          v -= 3 + (8 << 1);
          mask = 1 << 3;
          tab = VP8Cat4;
        } else if (v < 3 + (8 << 3)) {   // VP8Cat5  (5b)
          VP8PutBit(bw, 1, p[8]);
          VP8PutBit(bw, 0, p[10]);
          v -= 3 + (8 << 2);
          mask = 1 << 4;
          tab = VP8Cat5;
        } else {                         // VP8Cat6 (11b)
          VP8PutBit(bw, 1, p[8]);
          VP8PutBit(bw, 1, p[10]);
          v -= 3 + (8 << 3);
          mask = 1 << 10;
          tab = VP8Cat6;
        }
        while (mask) {
          VP8PutBit(bw, !!(v & mask), *tab++);
          mask >>= 1;
        }
      }
      p = res->prob[VP8EncBands[n]][2];
    }
    VP8PutBitUniform(bw, sign);
    if (n == 16 || !VP8PutBit(bw, n <= res->last, p[0])) {
      return 1;   // EOB
    }
  }
  return 1;
}